

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ArrayJoinPromiseNode<void>::~ArrayJoinPromiseNode(ArrayJoinPromiseNode<void> *this)

{
  ArrayJoinPromiseNode<void> *this_local;
  
  Array<kj::_::ExceptionOr<kj::_::Void>_>::~Array(&this->resultParts);
  ArrayJoinPromiseNodeBase::~ArrayJoinPromiseNodeBase(&this->super_ArrayJoinPromiseNodeBase);
  return;
}

Assistant:

ArrayJoinPromiseNode<void>::~ArrayJoinPromiseNode() {}